

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O1

void __thiscall OpenMD::BOPofR::initializeHistogram(BOPofR *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  
  if ((this->super_StaticAnalyser).nBins_ != 0) {
    piVar1 = (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      piVar1[uVar4] = 0;
      piVar2[uVar4] = 0;
      piVar3[uVar4] = 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->super_StaticAnalyser).nBins_);
  }
  return;
}

Assistant:

void BOPofR::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      RCount_[i] = 0;
      WofR_[i]   = 0;
      QofR_[i]   = 0;
    }
  }